

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O0

Span<char>
absl::lts_20240722::log_internal::EncodeMessageStart(uint64_t tag,uint64_t max_size,Span<char> *buf)

{
  uint64_t this;
  unsigned_long *puVar1;
  size_t len;
  ulong uVar2;
  size_type sVar3;
  size_t length_size;
  size_t local_40;
  size_t tag_type_size;
  uint64_t tag_type;
  Span<char> *buf_local;
  uint64_t max_size_local;
  uint64_t tag_local;
  Span<char> ret;
  
  tag_type = (uint64_t)buf;
  buf_local = (Span<char> *)max_size;
  max_size_local = tag;
  tag_type_size = anon_unknown_2::MakeTagType(tag,kLengthDelimited);
  local_40 = VarintSize(tag_type_size);
  length_size = Span<char>::size((Span<char> *)tag_type);
  puVar1 = std::min<unsigned_long>((unsigned_long *)&buf_local,&length_size);
  buf_local = (Span<char> *)*puVar1;
  len = VarintSize((uint64_t)buf_local);
  uVar2 = local_40 + len;
  sVar3 = Span<char>::size((Span<char> *)tag_type);
  this = tag_type;
  if (sVar3 < uVar2) {
    sVar3 = Span<char>::size((Span<char> *)tag_type);
    Span<char>::remove_suffix((Span<char> *)this,sVar3);
    Span<char>::Span((Span<char> *)&tag_local);
  }
  else {
    anon_unknown_2::EncodeRawVarint(tag_type_size,local_40,(Span<char> *)tag_type);
    _tag_local = Span<char>::subspan((Span<char> *)tag_type,0,len);
    anon_unknown_2::EncodeRawVarint(0,len,(Span<char> *)tag_type);
  }
  return _tag_local;
}

Assistant:

ABSL_MUST_USE_RESULT absl::Span<char> EncodeMessageStart(
    uint64_t tag, uint64_t max_size, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  max_size = std::min<uint64_t>(max_size, buf->size());
  const size_t length_size = VarintSize(max_size);
  if (tag_type_size + length_size > buf->size()) {
    buf->remove_suffix(buf->size());
    return absl::Span<char>();
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  const absl::Span<char> ret = buf->subspan(0, length_size);
  EncodeRawVarint(0, length_size, buf);
  return ret;
}